

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_2,_5,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  Vector<float,_3> local_9c;
  Vector<float,_3> local_90;
  tcu local_84 [12];
  undefined1 local_78 [16];
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  undefined1 local_58 [16];
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  VecAccess<float,_4,_3> local_38;
  
  getInputValue<2,5>((ShaderEvalContext *)local_58,(int)evalCtx);
  decrement<float,2,2>((MatrixCaseUtils *)&local_48,(Matrix<float,_2,_2> *)local_58);
  local_90.m_data[2] = local_44 + local_3c;
  local_90.m_data[0] = local_48;
  local_90.m_data[1] = local_40;
  getInputValue<2,5>((ShaderEvalContext *)local_78,(int)evalCtx);
  decrement<float,2,2>((MatrixCaseUtils *)&local_68,(Matrix<float,_2,_2> *)local_78);
  local_9c.m_data[2] = local_64 + local_5c;
  local_9c.m_data[0] = local_68;
  local_9c.m_data[1] = local_60;
  tcu::operator+(local_84,&local_90,&local_9c);
  local_38.m_vector = &evalCtx->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_84);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}